

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-server-close.c
# Opt level: O2

int run_test_pipe_server_close(void)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uStack_10;
  
  lVar2 = uv_default_loop();
  if (lVar2 == 0) {
    pcVar4 = "loop != NULL";
    uStack_10 = 0x47;
  }
  else {
    iVar1 = uv_pipe_init(lVar2,&pipe_server,0);
    if (iVar1 == 0) {
      iVar1 = uv_pipe_bind(&pipe_server,"/tmp/uv-test-sock");
      if (iVar1 == 0) {
        iVar1 = uv_listen(&pipe_server,0,pipe_server_connection_cb);
        if (iVar1 == 0) {
          iVar1 = uv_pipe_init(lVar2,&pipe_client,0);
          if (iVar1 == 0) {
            uv_pipe_connect(&connect_req,&pipe_client,"/tmp/uv-test-sock",pipe_client_connect_cb);
            iVar1 = uv_run(lVar2,0);
            if (iVar1 == 0) {
              if (pipe_client_connect_cb_called == 1) {
                if (pipe_close_cb_called == 2) {
                  uVar3 = uv_default_loop();
                  uv_walk(uVar3,close_walk_cb,0);
                  uv_run(uVar3,0);
                  uVar3 = uv_default_loop();
                  iVar1 = uv_loop_close(uVar3);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                  uStack_10 = 0x5c;
                }
                else {
                  pcVar4 = "pipe_close_cb_called == 2";
                  uStack_10 = 0x5a;
                }
              }
              else {
                pcVar4 = "pipe_client_connect_cb_called == 1";
                uStack_10 = 0x59;
              }
            }
            else {
              pcVar4 = "r == 0";
              uStack_10 = 0x58;
            }
          }
          else {
            pcVar4 = "r == 0";
            uStack_10 = 0x53;
          }
        }
        else {
          pcVar4 = "r == 0";
          uStack_10 = 0x50;
        }
      }
      else {
        pcVar4 = "r == 0";
        uStack_10 = 0x4d;
      }
    }
    else {
      pcVar4 = "r == 0";
      uStack_10 = 0x4a;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-server-close.c"
          ,uStack_10,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(pipe_server_close) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT(loop != NULL);

  r = uv_pipe_init(loop, &pipe_server, 0);
  ASSERT(r == 0);

  r = uv_pipe_bind(&pipe_server, TEST_PIPENAME);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*) &pipe_server, 0, pipe_server_connection_cb);
  ASSERT(r == 0);

  r = uv_pipe_init(loop, &pipe_client, 0);
  ASSERT(r == 0);

  uv_pipe_connect(&connect_req, &pipe_client, TEST_PIPENAME, pipe_client_connect_cb);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(pipe_client_connect_cb_called == 1);
  ASSERT(pipe_close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}